

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall google::protobuf::io::Printer::push_back(Printer *this,char c)

{
  char *pcVar1;
  bool bVar2;
  
  if ((this->failed_ == false) && ((this->buffer_size_ != 0 || (bVar2 = Next(this), bVar2)))) {
    pcVar1 = this->buffer_;
    this->buffer_ = pcVar1 + 1;
    *pcVar1 = c;
    this->buffer_size_ = this->buffer_size_ + -1;
    this->offset_ = this->offset_ + 1;
  }
  return;
}

Assistant:

void push_back(char c) {
    if (failed_) return;
    if (buffer_size_ == 0) {
      if (!Next()) return;
    }
    *buffer_++ = c;
    buffer_size_--;
    offset_++;
  }